

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O1

btCollisionObject * __thiscall
btCollisionWorldImporter::getCollisionObjectByName(btCollisionWorldImporter *this,char *name)

{
  btCollisionObject **ppbVar1;
  int iVar2;
  btCollisionObject *pbVar3;
  char cVar4;
  char *pcVar5;
  btHashString local_18;
  
  cVar4 = *name;
  if (cVar4 == '\0') {
    local_18.m_hash = 0x811c9dc5;
  }
  else {
    pcVar5 = name + 1;
    local_18.m_hash = 0x811c9dc5;
    do {
      local_18.m_hash = ((int)cVar4 ^ local_18.m_hash) * 0x1000193;
      cVar4 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar4 != '\0');
  }
  local_18.m_string = name;
  iVar2 = btHashMap<btHashString,_btCollisionObject_*>::findIndex(&this->m_nameColObjMap,&local_18);
  ppbVar1 = (this->m_nameColObjMap).m_valueArray.m_data;
  if ((ppbVar1 == (btCollisionObject **)0x0 || iVar2 == -1) ||
     (pbVar3 = ppbVar1[iVar2], pbVar3 == (btCollisionObject *)0x0)) {
    pbVar3 = (btCollisionObject *)0x0;
  }
  return pbVar3;
}

Assistant:

btCollisionObject* btCollisionWorldImporter::getCollisionObjectByName(const char* name)
{
	btCollisionObject** bodyPtr = m_nameColObjMap.find(name);
	if (bodyPtr && *bodyPtr)
	{
		return *bodyPtr;
	}
	return 0;
}